

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O3

MPP_RET jpege_proc_hal(void *ctx,HalEncTask *task)

{
  MppFrame s;
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  RK_U32 RVar4;
  uint uVar5;
  uint uVar6;
  RockchipSocType RVar7;
  uint uVar8;
  char *fmt;
  uint uVar9;
  int level;
  
  s = task->frame;
  lVar1 = *ctx;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","enter ctx %p\n","jpege_proc_hal",ctx);
  }
  uVar3 = *(undefined8 *)(lVar1 + 0x14);
  *(undefined8 *)((long)ctx + 8) = *(undefined8 *)(lVar1 + 0xc);
  *(undefined8 *)((long)ctx + 0x10) = uVar3;
  *(undefined4 *)((long)ctx + 0x2c) = *(undefined4 *)(lVar1 + 0x24);
  *(undefined4 *)((long)ctx + 0x30) = *(undefined4 *)(lVar1 + 0x38);
  *(undefined4 *)((long)ctx + 0x34) = *(undefined4 *)(lVar1 + 0x28);
  *(undefined4 *)((long)ctx + 0x38) = *(undefined4 *)(lVar1 + 0x50);
  *(undefined4 *)((long)ctx + 0x3c) = *(undefined4 *)(lVar1 + 0x58);
  RVar4 = mpp_frame_get_offset_x(s);
  *(RK_U32 *)((long)ctx + 0x40) = RVar4;
  RVar4 = mpp_frame_get_offset_y(s);
  *(RK_U32 *)((long)ctx + 0x44) = RVar4;
  *(undefined4 *)((long)ctx + 0x48) = *(undefined4 *)(lVar1 + 0x34c);
  *(undefined4 *)((long)ctx + 0x4c) = *(undefined4 *)(lVar1 + 0x350);
  *(undefined4 *)((long)ctx + 0x50) = *(undefined4 *)(lVar1 + 0x358);
  *(undefined4 *)((long)ctx + 0x54) = *(undefined4 *)(lVar1 + 0x354);
  *(undefined8 *)((long)ctx + 0x58) = *(undefined8 *)(lVar1 + 0x360);
  *(undefined8 *)((long)ctx + 0x60) = *(undefined8 *)(lVar1 + 0x368);
  *(undefined4 *)((long)ctx + 0xa8) = 0;
  *(undefined8 *)((long)ctx + 0xa0) = 0;
  if (((byte)jpege_debug & 0x10) != 0) {
    _mpp_log_l(4,"jpege_api_v2","Chroma format %d\n",(char *)0x0,(ulong)*(uint *)((long)ctx + 0x30))
    ;
  }
  if (*(int *)((long)ctx + 0x30) == 0) {
    *(undefined4 *)((long)ctx + 0x30) = 4;
switchD_001c67f1_caseD_4:
    *(undefined8 *)((long)ctx + 0xac) = 0x2020100000003;
    *(undefined8 *)((long)ctx + 0xb4) = 0x101010301010102;
    uVar6 = 0x20201;
    goto LAB_001c687f;
  }
  *(undefined4 *)((long)ctx + 0xb8) = 0;
  *(undefined8 *)((long)ctx + 0xb0) = 0;
  switch(*(int *)((long)ctx + 0x30)) {
  case 1:
    *(undefined8 *)((long)ctx + 0xac) = 0x1010100000001;
    goto LAB_001c6845;
  default:
    *(undefined8 *)((long)ctx + 0xac) = 0x1010100000001;
    _mpp_log_l(2,"jpege_api_v2","Unsupported chroma format %d\n",(char *)0x0);
    uVar6 = *(uint *)((long)ctx + 0xb0);
    break;
  case 4:
    goto switchD_001c67f1_caseD_4;
  case 5:
    *(undefined8 *)((long)ctx + 0xac) = 0x1020100000003;
    *(undefined8 *)((long)ctx + 0xb4) = 0x101010301010102;
    uVar6 = 0x10201;
    break;
  case 7:
    *(undefined8 *)((long)ctx + 0xac) = 0x1010100000003;
    *(undefined8 *)((long)ctx + 0xb4) = 0x101010301010102;
LAB_001c6845:
    uVar6 = 0x10101;
  }
LAB_001c687f:
  uVar5 = uVar6 >> 8 & 0xff;
  uVar9 = uVar5 * 8;
  *(uint *)((long)ctx + 0x24) = uVar9;
  uVar8 = uVar6 >> 0xd & 0x7f8;
  *(uint *)((long)ctx + 0x28) = uVar8;
  uVar2 = (ulong)((*(int *)((long)ctx + 8) + uVar5 * 8) - 1) / (ulong)uVar9;
  uVar6 = (uint)uVar2;
  *(uint *)((long)ctx + 0x18) = uVar6;
  uVar8 = ((uVar8 + *(int *)((long)ctx + 0xc)) - 1) / uVar8;
  *(uint *)((long)ctx + 0x1c) = uVar8;
  *(uint *)((long)ctx + 0x20) = uVar8 * uVar6;
  if (*(int *)(lVar1 + 0xe94) != 0) {
    if (*(int *)(lVar1 + 0xe94) == 2) {
      uVar9 = *(uint *)(lVar1 + 0xe98);
      if (uVar9 - 1 < uVar8 * uVar6) {
        uVar9 = (uVar6 + uVar9) - 1;
        if ((uVar9 < uVar6) || (uVar6 = (uint)(uVar9 / uVar2), uVar8 <= uVar6)) goto LAB_001c69bf;
        *(uint *)((long)ctx + 0xa4) = uVar6;
        RVar7 = mpp_get_soc_type();
        if ((RVar7 != ROCKCHIP_SOC_RK3576) ||
           (uVar9 = *(uint *)(lVar1 + 0xe98), *(uint *)((long)ctx + 0x20) < uVar9)) {
          uVar9 = uVar6 * *(int *)((long)ctx + 0x18);
        }
        *(uint *)((long)ctx + 0xa8) = uVar9;
        *(uint *)((long)ctx + 0xa0) = (uint)(*(int *)(lVar1 + 4) != 0);
        if (((byte)jpege_debug & 1) == 0) goto LAB_001c69bf;
        uVar9 = *(uint *)((long)ctx + 0xa4);
        fmt = "Split by CTU, part_rows %d, restart_ri %d";
        level = 4;
      }
      else {
        fmt = "warning: invalid split arg %d > max %d\n";
        level = 2;
      }
      _mpp_log_l(level,"jpege_api_v2",fmt,"jpege_proc_hal",(ulong)uVar9);
    }
    else {
      _mpp_log_l(2,"jpege_api_v2","warning: only mcu split is supported\n","jpege_proc_hal");
    }
  }
LAB_001c69bf:
  task->valid = 1;
  (task->syntax).data = (void *)((long)ctx + 8);
  (task->syntax).number = 1;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","leave ctx %p\n","jpege_proc_hal",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_proc_hal(void *ctx, HalEncTask *task)
{
    JpegeCtx *p = (JpegeCtx *)ctx;
    MppFrame frame = task->frame;
    JpegeSyntax *syntax = &p->syntax;
    MppEncCfgSet *cfg = p->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncCodecCfg *codec = &cfg->codec;
    MppEncSliceSplit *split = &cfg->split;

    jpege_dbg_func("enter ctx %p\n", ctx);

    syntax->width       = prep->width;
    syntax->height      = prep->height;
    syntax->hor_stride  = prep->hor_stride;
    syntax->ver_stride  = prep->ver_stride;
    syntax->format      = prep->format;
    syntax->format_out  = prep->format_out;
    syntax->color       = prep->color;
    syntax->rotation    = prep->rotation;
    syntax->mirroring   = prep->mirroring;
    syntax->offset_x    = mpp_frame_get_offset_x(frame);
    syntax->offset_y    = mpp_frame_get_offset_y(frame);
    syntax->quality     = codec->jpeg.quant;
    syntax->q_factor    = codec->jpeg.q_factor;
    syntax->qf_min      = codec->jpeg.qf_min;
    syntax->qf_max      = codec->jpeg.qf_max;
    syntax->qtable_y    = codec->jpeg.qtable_y;
    syntax->qtable_c    = codec->jpeg.qtable_u;
    syntax->part_rows   = 0;
    syntax->restart_ri  = 0;
    syntax->low_delay   = 0;

    init_jpeg_component_info(syntax);

    if (split->split_mode) {
        RK_U32 mb_w = syntax->mcu_hor_cnt;
        RK_U32 mb_h = syntax->mcu_ver_cnt;
        RK_U32 part_rows = 0;

        if (split->split_mode == MPP_ENC_SPLIT_BY_CTU) {
            RK_U32 part_mbs = split->split_arg;

            if (part_mbs > 0 && part_mbs <= syntax->mcu_cnt) {
                part_rows = (part_mbs + mb_w - 1) / mb_w;
                if (part_rows >= mb_h)
                    part_rows = 0;
            } else {
                mpp_err_f("warning: invalid split arg %d > max %d\n",
                          part_mbs, syntax->mcu_cnt);
            }
        } else {
            mpp_err_f("warning: only mcu split is supported\n");
        }

        if (part_rows) {
            syntax->part_rows   = part_rows;
            if (mpp_get_soc_type() == ROCKCHIP_SOC_RK3576 && split->split_arg <= syntax->mcu_cnt)
                syntax->restart_ri = split->split_arg;
            else
                syntax->restart_ri  = syntax->mcu_hor_cnt * part_rows;
            syntax->low_delay   = cfg->base.low_delay && part_rows;
            jpege_dbg_func("Split by CTU, part_rows %d, restart_ri %d",
                           syntax->part_rows, syntax->restart_ri);
        }
    }

    task->valid = 1;
    task->syntax.data = syntax;
    task->syntax.number = 1;

    jpege_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}